

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O1

str_attr_accessor * __thiscall
pybind11::detail::
object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>::attr
          (str_attr_accessor *__return_storage_ptr__,
          object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>
          *this,char *key)

{
  object *poVar1;
  object local_20;
  
  poVar1 = accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                     ((accessor<pybind11::detail::accessor_policies::str_attr> *)this);
  local_20.super_handle.m_ptr = (handle)(poVar1->super_handle).m_ptr;
  if (local_20.super_handle.m_ptr != (PyObject *)0x0) {
    ((PyObject *)local_20.super_handle.m_ptr)->ob_refcnt =
         ((PyObject *)local_20.super_handle.m_ptr)->ob_refcnt + 1;
  }
  (__return_storage_ptr__->obj).m_ptr = (PyObject *)local_20.super_handle.m_ptr;
  __return_storage_ptr__->key = key;
  (__return_storage_ptr__->cache).super_handle.m_ptr = (PyObject *)0x0;
  object::~object(&local_20);
  return __return_storage_ptr__;
}

Assistant:

str_attr_accessor object_api<D>::attr(const char *key) const {
    return {derived(), key};
}